

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemTransfer(LLVMPointerGraphBuilder *this,IntrinsicInst *I)

{
  Value *val;
  Value *val_00;
  ID IVar1;
  PSNode *pPVar2;
  raw_ostream *prVar3;
  undefined8 *puVar4;
  PSNode *srcNode;
  PSNode *destNode;
  PSNode *local_38;
  PSNode *local_30;
  uint64_t local_28;
  
  IVar1 = llvm::IntrinsicInst::getIntrinsicID(I);
  if ((IVar1 != 0xc2) && (IVar1 != 0xbf)) {
    prVar3 = (raw_ostream *)llvm::errs();
    prVar3 = llvm::raw_ostream::operator<<(prVar3,"ERR: unhandled mem transfer intrinsic");
    prVar3 = llvm::operator<<(prVar3,(Value *)I);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    abort();
  }
  puVar4 = (undefined8 *)((long)I - (ulong)(uint)(*(int *)&I->field_0x14 << 5));
  val = (Value *)*puVar4;
  val_00 = (Value *)puVar4[4];
  local_28 = llvmutils::getConstantValue((Value *)puVar4[8]);
  local_30 = getOperand(this,val);
  local_38 = getOperand(this,val_00);
  pPVar2 = PointerGraph::
           create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNode*&,unsigned_long&>
                     ((PointerGraph *)this,&local_38,&local_30,&local_28);
  return pPVar2;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createMemTransfer(const llvm::IntrinsicInst *I) {
    using namespace llvm;
    const Value *dest, *src; //, *lenVal;
    uint64_t lenVal = Offset::UNKNOWN;

    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
        dest = I->getOperand(0);
        src = I->getOperand(1);
        lenVal = llvmutils::getConstantValue(I->getOperand(2));
        break;
    default:
        errs() << "ERR: unhandled mem transfer intrinsic" << *I << "\n";
        abort();
    }

    PSNode *destNode = getOperand(dest);
    PSNode *srcNode = getOperand(src);
    PSNode *node = PS.create<PSNodeType::MEMCPY>(srcNode, destNode, lenVal);

    return node;
}